

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvgrast.h
# Opt level: O1

void nsvg__roundCap(NSVGrasterizer *r,NSVGpoint *left,NSVGpoint *right,NSVGpoint *p,float dx,
                   float dy,float lineWidth,int ncap,int connect)

{
  float fVar1;
  float fVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float x0;
  float x1;
  float fVar8;
  float y1;
  float y0;
  float y1_00;
  float fVar9;
  float x1_00;
  
  if (ncap < 1) {
    fVar6 = 0.0;
    fVar5 = 0.0;
    y1 = 0.0;
    x1_00 = 0.0;
  }
  else {
    fVar1 = p->x;
    fVar2 = p->y;
    iVar3 = 0;
    fVar4 = 0.0;
    fVar7 = 0.0;
    x0 = 0.0;
    fVar8 = 0.0;
    y0 = 0.0;
    fVar9 = 0.0;
    do {
      fVar5 = ((float)iVar3 / (float)(ncap + -1)) * 3.1415927;
      fVar6 = cosf(fVar5);
      fVar6 = fVar6 * lineWidth * 0.5;
      fVar5 = sinf(fVar5);
      fVar5 = fVar5 * lineWidth * 0.5;
      x1 = -dx * fVar5 + -dy * fVar6 + fVar1;
      y1_00 = fVar5 * -dy + fVar6 * dx + fVar2;
      fVar5 = fVar4;
      fVar6 = fVar7;
      y1 = y1_00;
      x1_00 = x1;
      if ((iVar3 != 0) &&
         (nsvg__addEdge(r,x0,y0,x1,y1_00), fVar5 = x1, fVar6 = y1_00, y1 = fVar8, x1_00 = fVar9,
         iVar3 - ncap != -1)) {
        fVar5 = fVar4;
        fVar6 = fVar7;
      }
      iVar3 = iVar3 + 1;
      fVar4 = fVar5;
      fVar7 = fVar6;
      x0 = x1;
      fVar8 = y1;
      y0 = y1_00;
      fVar9 = x1_00;
    } while (iVar3 != ncap);
  }
  if (connect != 0) {
    nsvg__addEdge(r,left->x,left->y,x1_00,y1);
    nsvg__addEdge(r,fVar5,fVar6,right->x,right->y);
  }
  left->x = x1_00;
  left->y = y1;
  right->x = fVar5;
  right->y = fVar6;
  return;
}

Assistant:

static void nsvg__roundCap(NSVGrasterizer* r, NSVGpoint* left, NSVGpoint* right, NSVGpoint* p, float dx, float dy, float lineWidth, int ncap, int connect)
{
	int i;
	float w = lineWidth * 0.5f;
	float px = p->x, py = p->y;
	float dlx = dy, dly = -dx;
	float lx = 0, ly = 0, rx = 0, ry = 0, prevx = 0, prevy = 0;

	for (i = 0; i < ncap; i++) {
		float a = (float)i/(float)(ncap-1)*NSVG_PI;
		float ax = cosf(a) * w, ay = sinf(a) * w;
		float x = px - dlx*ax - dx*ay;
		float y = py - dly*ax - dy*ay;

		if (i > 0)
			nsvg__addEdge(r, prevx, prevy, x, y);

		prevx = x;
		prevy = y;

		if (i == 0) {
			lx = x; ly = y;
		} else if (i == ncap-1) {
			rx = x; ry = y;
		}
	}

	if (connect) {
		nsvg__addEdge(r, left->x, left->y, lx, ly);
		nsvg__addEdge(r, rx, ry, right->x, right->y);
	}

	left->x = lx; left->y = ly;
	right->x = rx; right->y = ry;
}